

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

int __thiscall
glcts::TextureCubeMapArraySamplingTest::bufferDefinition::bind
          (bufferDefinition *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  GLenum err;
  int extraout_EAX;
  InternalError *this_00;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  
  if (this->m_buffer_object_id != 0xffffffff) {
    (*this->m_gl->bindBuffer)(__fd,this->m_buffer_object_id);
    err = (*this->m_gl->getError)();
    glu::checkError(err,"Failed to bind buffer.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                    ,0x1031);
    return extraout_EAX;
  }
  this_00 = (InternalError *)
            __cxa_allocate_exception
                      (0x38,CONCAT44(in_register_00000034,__fd),__addr,
                       CONCAT44(in_register_0000000c,__len));
  tcu::InternalError::InternalError
            (this_00,"Invalid buffer object id used",fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
             ,0x102d);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCubeMapArraySamplingTest::bufferDefinition::bind(glw::GLenum target) const
{
	if (m_invalid_buffer_object_id == m_buffer_object_id)
	{
		throw tcu::InternalError("Invalid buffer object id used", "", __FILE__, __LINE__);
	}

	m_gl->bindBuffer(target, m_buffer_object_id);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to bind buffer.");
}